

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall
cmListCommand::HandleTransformCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  initializer_list<ActionDescriptor> __l;
  invalid_argument *piVar1;
  size_t sVar2;
  iterator iVar3;
  bool bVar4;
  __type _Var5;
  uint uVar6;
  size_type sVar7;
  const_reference pvVar8;
  pointer pAVar9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  pointer pTVar12;
  size_t sVar13;
  undefined1 *puVar14;
  invalid_argument *piVar15;
  char *value_00;
  _Base_ptr __n;
  ActionDescriptor *local_1210;
  string local_1148 [2];
  transform_error *e;
  undefined1 local_10f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_10b8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_10a8;
  string local_1098;
  undefined1 local_1078 [8];
  ostringstream error_2;
  allocator<char> local_ef9;
  string local_ef8;
  unique_ptr<(anonymous_namespace)::TransformSelectorFor,_std::default_delete<(anonymous_namespace)::TransformSelectorFor>_>
  local_ed8;
  allocator<char> local_ec9;
  string local_ec8;
  invalid_argument *anon_var_0_2;
  size_t pos_2;
  string local_e90;
  invalid_argument *anon_var_0_1;
  size_t pos_1;
  int local_e58;
  int iStack_e54;
  bool valid;
  int step;
  int stop;
  int start;
  undefined1 local_e28 [16];
  string local_e18;
  invalid_argument *anon_var_0;
  size_t sStack_de8;
  int value;
  size_t pos;
  vector<int,_std::allocator<int>_> indexes;
  undefined1 local_da8 [8];
  ostringstream error_4;
  undefined1 local_c30 [16];
  string local_c20;
  string local_c00;
  undefined1 local_be0 [8];
  ostringstream error_3;
  allocator<char> local_a61;
  undefined1 local_a60 [8];
  string OUTPUT_VARIABLE;
  undefined1 local_a38 [8];
  string FOR;
  undefined1 local_a10 [8];
  string AT;
  undefined1 local_9e8 [8];
  string REGEX;
  transform_error *e_1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_989;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_988;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_980;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_978;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_970;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_968;
  string local_950;
  undefined1 local_930 [8];
  ostringstream error_1;
  int local_7b4;
  string local_7b0;
  undefined1 local_790 [8];
  ostringstream error;
  _Self local_618;
  string local_610;
  key_type local_5f0;
  _Self local_5a8;
  iterator descriptor;
  size_type index;
  anon_class_8_1_bc00122b local_590;
  transform_type local_588;
  allocator<char> local_561;
  string local_560;
  anon_class_8_1_bc00122b local_540;
  transform_type local_538;
  allocator<char> local_511;
  string local_510;
  anon_class_8_1_bc00122b local_4f0;
  transform_type local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  anon_class_8_1_bc00122b local_4a0;
  transform_type local_498;
  allocator<char> local_471;
  string local_470;
  anon_class_8_1_bc00122b local_450;
  transform_type local_448;
  allocator<char> local_421;
  string local_420;
  anon_class_8_1_bc00122b local_400;
  transform_type local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  anon_class_8_1_bc00122b local_3b0;
  transform_type local_3a8;
  allocator<char> local_381;
  string local_380;
  ActionDescriptor *local_360;
  ActionDescriptor local_358;
  undefined1 local_310 [72];
  undefined1 local_2c8 [72];
  undefined1 local_280 [72];
  undefined1 local_238 [72];
  undefined1 local_1f0 [72];
  undefined1 local_1a8 [72];
  iterator local_160;
  size_type local_158;
  allocator<ActionDescriptor> local_14a;
  anon_class_1_0_00000001 local_149;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_148;
  undefined1 local_128 [8];
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  descriptors;
  Command command;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmListCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar7 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command TRANSFORM requires an action to be specified.",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  else {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,1);
    HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
    string>>const&)::Command::Command(std::__cxx11::string_const__
              (&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar8);
    std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
    function<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0,void>
              ((function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_148
               ,&local_149);
    std::allocator<ActionDescriptor>::allocator(&local_14a);
    std::
    set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
    ::set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
           *)local_128,&local_148,&local_14a);
    std::allocator<ActionDescriptor>::~allocator(&local_14a);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_148);
    local_360 = &local_358;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"APPEND",&local_381);
    local_3b0.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__1,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_3a8,&local_3b0)
    ;
    HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
    string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
    __cxx11::string(std::__cxx11::string_const__>_(&local_358,&local_380,1,&local_3a8);
    local_360 = (ActionDescriptor *)local_310;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"PREPEND",&local_3d1);
    local_400.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__2,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_3f8,&local_400)
    ;
    HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
    string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
    __cxx11::string(std::__cxx11::string_const__>_(local_310,&local_3d0,1,&local_3f8);
    local_360 = (ActionDescriptor *)local_2c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"TOUPPER",&local_421);
    local_450.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__3,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_448,&local_450)
    ;
    HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
    string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
    __cxx11::string(std::__cxx11::string_const__>_(local_2c8,&local_420,0,&local_448);
    local_360 = (ActionDescriptor *)local_280;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"TOLOWER",&local_471);
    local_4a0.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__4,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_498,&local_4a0)
    ;
    HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
    string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
    __cxx11::string(std::__cxx11::string_const__>_(local_280,&local_470,0,&local_498);
    local_360 = (ActionDescriptor *)local_238;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"STRIP",&local_4c1);
    local_4f0.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__5,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_4e8,&local_4f0)
    ;
    HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
    string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
    __cxx11::string(std::__cxx11::string_const__>_(local_238,&local_4c0,0,&local_4e8);
    local_360 = (ActionDescriptor *)local_1f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"GENEX_STRIP",&local_511);
    local_540.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__6,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_538,&local_540)
    ;
    HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
    string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
    __cxx11::string(std::__cxx11::string_const__>_(local_1f0,&local_510,0,&local_538);
    local_360 = (ActionDescriptor *)local_1a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"REPLACE",&local_561);
    local_590.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__7,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_588,&local_590)
    ;
    HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
    string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
    __cxx11::string(std::__cxx11::string_const__>_(local_1a8,&local_560,2,&local_588);
    local_160 = &local_358;
    local_158 = 7;
    __l._M_len = 7;
    __l._M_array = local_160;
    std::
    set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
    ::operator=((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                 *)local_128,__l);
    local_1210 = (ActionDescriptor *)&local_160;
    do {
      local_1210 = local_1210 + -1;
      HandleTransformCommand::ActionDescriptor::~ActionDescriptor(local_1210);
    } while (local_1210 != &local_358);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_588);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator(&local_561);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_538);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_4e8);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_498);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_448);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_3a8);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
    descriptor._M_node = (_Base_ptr)0x2;
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,2);
    std::__cxx11::string::string((string *)&local_610,(string *)pvVar8);
    HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
    string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string_(&local_5f0,&local_610)
    ;
    local_5a8._M_node =
         (_Base_ptr)
         std::
         set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
         ::find((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                 *)local_128,&local_5f0);
    HandleTransformCommand::ActionDescriptor::~ActionDescriptor(&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    local_618._M_node =
         (_Base_ptr)
         std::
         set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
         ::end((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                *)local_128);
    bVar4 = std::operator==(&local_5a8,&local_618);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_790);
      poVar10 = std::operator<<((ostream *)local_790," sub-command TRANSFORM, ");
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,(size_type)descriptor._M_node);
      poVar10 = std::operator<<(poVar10,(string *)pvVar8);
      std::operator<<(poVar10," invalid action.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_7b0);
      std::__cxx11::string::~string((string *)&local_7b0);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_790);
    }
    else {
      descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      iVar3._M_node = descriptor._M_node;
      pAVar9 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
      if (sVar7 < (ulong)((long)&(iVar3._M_node)->_M_color + (long)pAVar9->Arity)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_930);
        poVar10 = std::operator<<((ostream *)local_930,"sub-command TRANSFORM, action ");
        pAVar9 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        poVar10 = std::operator<<(poVar10,(string *)pAVar9);
        poVar10 = std::operator<<(poVar10," expects ");
        pAVar9 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,pAVar9->Arity);
        std::operator<<(poVar10," argument(s).");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_950);
        std::__cxx11::string::~string((string *)&local_950);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_930);
      }
      else {
        pAVar9 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        std::__cxx11::string::operator=
                  ((string *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)pAVar9);
        pAVar9 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        descriptor._M_node =
             (_Base_ptr)((long)&(descriptor._M_node)->_M_color + (long)pAVar9->Arity);
        pAVar9 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        if (0 < pAVar9->Arity) {
          local_978._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(local_20);
          local_970 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator+(&local_978,3);
          local_988._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(local_20);
          local_980 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator+(&local_988,(difference_type)descriptor._M_node);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_989);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_968
                     ,local_970,local_980,&local_989);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&command.ListName.field_2 + 8),&local_968);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_968);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_989);
        }
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                "REPLACE");
        if (bVar4) {
          std::
          make_unique<(anonymous_namespace)::TransformReplace,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,cmMakefile*&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&e_1,(cmMakefile **)((long)&command.ListName.field_2 + 8));
          std::
          unique_ptr<(anonymous_namespace)::TransformAction,std::default_delete<(anonymous_namespace)::TransformAction>>
          ::operator=((unique_ptr<(anonymous_namespace)::TransformAction,std::default_delete<(anonymous_namespace)::TransformAction>>
                       *)&command.Arguments.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (unique_ptr<(anonymous_namespace)::TransformReplace,_std::default_delete<(anonymous_namespace)::TransformReplace>_>
                       *)&e_1);
          std::
          unique_ptr<(anonymous_namespace)::TransformReplace,_std::default_delete<(anonymous_namespace)::TransformReplace>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformReplace,_std::default_delete<(anonymous_namespace)::TransformReplace>_>
                         *)&e_1);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_9e8,"REGEX",(allocator<char> *)(AT.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(AT.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_a10,"AT",(allocator<char> *)(FOR.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(FOR.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_a38,"FOR",
                   (allocator<char> *)(OUTPUT_VARIABLE.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(OUTPUT_VARIABLE.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_a60,"OUTPUT_VARIABLE",&local_a61);
        std::allocator<char>::~allocator(&local_a61);
LAB_0041dad7:
        do {
          p_Var11 = (_Base_ptr)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(local_20);
          if (p_Var11 <= descriptor._M_node) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_10f0);
            bVar4 = GetList(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_10f0,(string *)((long)&command.Name.field_2 + 8));
            if (bVar4) {
              bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&command.Action);
              if (!bVar4) {
                std::make_unique<(anonymous_namespace)::TransformNoSelector>();
                std::
                unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                ::operator=((unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                             *)&command.Action,
                            (unique_ptr<(anonymous_namespace)::TransformNoSelector,_std::default_delete<(anonymous_namespace)::TransformNoSelector>_>
                             *)&e);
                std::
                unique_ptr<(anonymous_namespace)::TransformNoSelector,_std::default_delete<(anonymous_namespace)::TransformNoSelector>_>
                ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformNoSelector,_std::default_delete<(anonymous_namespace)::TransformNoSelector>_>
                               *)&e);
              }
              pTVar12 = std::
                        unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        ::operator->((unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                      *)&command.Action);
              pAVar9 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
              (*pTVar12->_vptr_TransformSelector[4])(pTVar12,local_10f0,&pAVar9->Transform);
              this_00 = (this->super_cmCommand).Makefile;
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (local_1148,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_10f0,";");
              value_00 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition(this_00,(string *)&command.Selector,value_00);
              std::__cxx11::string::~string((string *)local_1148);
            }
            else {
              cmMakefile::AddDefinition
                        ((this->super_cmCommand).Makefile,(string *)&command.Selector,"");
            }
            this_local._7_1_ = 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_10f0);
            break;
          }
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,(size_type)descriptor._M_node);
          _Var5 = std::operator==(pvVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_9e8);
          if (_Var5) {
LAB_0041db5b:
            bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&command.Action);
            if (bVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_be0);
              poVar10 = std::operator<<((ostream *)local_be0,
                                        "sub-command TRANSFORM, selector already specified (");
              pTVar12 = std::
                        unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        ::operator->((unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                      *)&command.Action);
              poVar10 = std::operator<<(poVar10,(string *)&pTVar12->Tag);
              std::operator<<(poVar10,").");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_c00);
              std::__cxx11::string::~string((string *)&local_c00);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_be0);
              break;
            }
          }
          else {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_20,(size_type)descriptor._M_node);
            _Var5 = std::operator==(pvVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_a10);
            if (_Var5) goto LAB_0041db5b;
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_20,(size_type)descriptor._M_node);
            _Var5 = std::operator==(pvVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_a38);
            if (_Var5) goto LAB_0041db5b;
          }
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,(size_type)descriptor._M_node);
          _Var5 = std::operator==(pvVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_9e8);
          if (_Var5) {
            p_Var11 = (_Base_ptr)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(local_20);
            descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
            if (p_Var11 == descriptor._M_node) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c20,
                         "sub-command TRANSFORM, selector REGEX expects \'regular expression\' argument."
                         ,(allocator<char> *)(local_c30 + 0xf));
              cmCommand::SetError(&this->super_cmCommand,&local_c20);
              std::__cxx11::string::~string((string *)&local_c20);
              std::allocator<char>::~allocator((allocator<char> *)(local_c30 + 0xf));
              this_local._7_1_ = 0;
              break;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_20,(size_type)descriptor._M_node);
            std::
            make_unique<(anonymous_namespace)::TransformSelectorRegex,std::__cxx11::string_const&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_c30);
            std::
            unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
            ::operator=((unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                         *)&command.Action,
                        (unique_ptr<(anonymous_namespace)::TransformSelectorRegex,_std::default_delete<(anonymous_namespace)::TransformSelectorRegex>_>
                         *)local_c30);
            std::
            unique_ptr<(anonymous_namespace)::TransformSelectorRegex,_std::default_delete<(anonymous_namespace)::TransformSelectorRegex>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformSelectorRegex,_std::default_delete<(anonymous_namespace)::TransformSelectorRegex>_>
                           *)local_c30);
            pTVar12 = std::
                      unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                      ::operator->((unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                    *)&command.Action);
            uVar6 = (*pTVar12->_vptr_TransformSelector[2])(pTVar12,0);
            if ((uVar6 & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_da8);
              std::operator<<((ostream *)local_da8,
                              "sub-command TRANSFORM, selector REGEX failed to compile regex \"");
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_20,(size_type)descriptor._M_node);
              poVar10 = std::operator<<((ostream *)local_da8,(string *)pvVar8);
              std::operator<<(poVar10,"\".");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,
                                  (string *)
                                  &indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string
                        ((string *)
                         &indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_da8);
              break;
            }
            descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
            goto LAB_0041dad7;
          }
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,(size_type)descriptor._M_node);
          _Var5 = std::operator==(pvVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_a10);
          if (!_Var5) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_20,(size_type)descriptor._M_node);
            _Var5 = std::operator==(pvVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_a38);
            if (_Var5) {
              puVar14 = (undefined1 *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(local_20);
              p_Var11 = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
              if (puVar14 <= (byte *)((long)&(descriptor._M_node)->_M_color + 2U)) {
                descriptor._M_node = p_Var11;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&start,
                           "sub-command TRANSFORM, selector FOR expects, at least, two arguments.",
                           (allocator<char> *)((long)&stop + 3));
                cmCommand::SetError(&this->super_cmCommand,(string *)&start);
                std::__cxx11::string::~string((string *)&start);
                std::allocator<char>::~allocator((allocator<char> *)((long)&stop + 3));
                this_local._7_1_ = 0;
                break;
              }
              step = 0;
              iStack_e54 = 0;
              local_e58 = 1;
              pos_1._7_1_ = 1;
              descriptor._M_node = p_Var11;
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_20,(size_type)p_Var11);
              step = std::__cxx11::stoi(pvVar8,(size_t *)&anon_var_0_1,10);
              piVar1 = anon_var_0_1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,(size_type)descriptor._M_node);
              piVar15 = (invalid_argument *)std::__cxx11::string::length();
              if (piVar1 == piVar15) {
                descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
                pvVar8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](local_20,(size_type)descriptor._M_node);
                iStack_e54 = std::__cxx11::stoi(pvVar8,(size_t *)&anon_var_0_1,10);
                piVar1 = anon_var_0_1;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_20,(size_type)descriptor._M_node);
                piVar15 = (invalid_argument *)std::__cxx11::string::length();
                if (piVar1 != piVar15) {
                  pos_1._7_1_ = 0;
                }
              }
              else {
                pos_1._7_1_ = 0;
              }
              if ((pos_1._7_1_ & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e90,
                           "sub-command TRANSFORM, selector FOR expects, at least, two numeric values."
                           ,(allocator<char> *)((long)&pos_2 + 7));
                cmCommand::SetError(&this->super_cmCommand,&local_e90);
                std::__cxx11::string::~string((string *)&local_e90);
                std::allocator<char>::~allocator((allocator<char> *)((long)&pos_2 + 7));
                this_local._7_1_ = 0;
                break;
              }
              p_Var11 = (_Base_ptr)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(local_20);
              descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
              if (descriptor._M_node < p_Var11) {
                pvVar8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](local_20,(size_type)descriptor._M_node);
                local_e58 = std::__cxx11::stoi(pvVar8,(size_t *)&anon_var_0_2,10);
                piVar1 = anon_var_0_2;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_20,(size_type)descriptor._M_node);
                piVar15 = (invalid_argument *)std::__cxx11::string::length();
                if (piVar1 == piVar15) {
                  descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
                }
                else {
                  local_e58 = 1;
                }
              }
              if (local_e58 < 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_ec8,
                           "sub-command TRANSFORM, selector FOR expects non negative numeric value for <step>."
                           ,&local_ec9);
                cmCommand::SetError(&this->super_cmCommand,&local_ec8);
                std::__cxx11::string::~string((string *)&local_ec8);
                std::allocator<char>::~allocator(&local_ec9);
              }
              std::make_unique<(anonymous_namespace)::TransformSelectorFor,int&,int&,int&>
                        ((int *)&local_ed8,&step,&stack0xfffffffffffff1ac);
              std::
              unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
              ::operator=((unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                           *)&command.Action,&local_ed8);
              std::
              unique_ptr<(anonymous_namespace)::TransformSelectorFor,_std::default_delete<(anonymous_namespace)::TransformSelectorFor>_>
              ::~unique_ptr(&local_ed8);
            }
            else {
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_20,(size_type)descriptor._M_node);
              _Var5 = std::operator==(pvVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_a60);
              if (!_Var5) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1078);
                poVar10 = std::operator<<((ostream *)local_1078,"sub-command TRANSFORM, \'");
                local_10b8 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       (local_20);
                local_10a8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ::advance(&local_10b8,(difference_type)descriptor._M_node);
                cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                          (&local_1098,&local_10a8," ");
                poVar10 = std::operator<<(poVar10,(string *)&local_1098);
                std::operator<<(poVar10,"\': unexpected argument(s).");
                std::__cxx11::string::~string((string *)&local_1098);
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,
                                    (string *)
                                    &varArgsExpanded.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::__cxx11::string::~string
                          ((string *)
                           &varArgsExpanded.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                this_local._7_1_ = 0;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1078);
                break;
              }
              p_Var11 = (_Base_ptr)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(local_20);
              __n = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
              if (p_Var11 == __n) {
                descriptor._M_node = __n;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_ef8,
                           "sub-command TRANSFORM, OUTPUT_VARIABLE expects variable name argument.",
                           &local_ef9);
                cmCommand::SetError(&this->super_cmCommand,&local_ef8);
                std::__cxx11::string::~string((string *)&local_ef8);
                std::allocator<char>::~allocator(&local_ef9);
                this_local._7_1_ = 0;
                break;
              }
              descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 2);
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_20,(size_type)__n);
              std::__cxx11::string::operator=((string *)&command.Selector,(string *)pvVar8);
            }
            goto LAB_0041dad7;
          }
          std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&pos);
          while( true ) {
            p_Var11 = (_Base_ptr)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(local_20);
            descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
            if (p_Var11 <= descriptor._M_node) break;
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_20,(size_type)descriptor._M_node);
            anon_var_0._4_4_ = std::__cxx11::stoi(pvVar8,&stack0xfffffffffffff218,10);
            sVar2 = sStack_de8;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_20,(size_type)descriptor._M_node);
            sVar13 = std::__cxx11::string::length();
            if (sVar2 != sVar13) break;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&pos,
                       (value_type_conflict2 *)((long)&anon_var_0 + 4));
          }
          bVar4 = std::vector<int,_std::allocator<int>_>::empty
                            ((vector<int,_std::allocator<int>_> *)&pos);
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e18,
                       "sub-command TRANSFORM, selector AT expects at least one numeric value.",
                       (allocator<char> *)(local_e28 + 0xf));
            cmCommand::SetError(&this->super_cmCommand,&local_e18);
            std::__cxx11::string::~string((string *)&local_e18);
            std::allocator<char>::~allocator((allocator<char> *)(local_e28 + 0xf));
            this_local._7_1_ = 0;
            local_7b4 = 1;
          }
          else {
            std::
            make_unique<(anonymous_namespace)::TransformSelectorAt,std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)local_e28);
            std::
            unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
            ::operator=((unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                         *)&command.Action,
                        (unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
                         *)local_e28);
            std::
            unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
                           *)local_e28);
            local_7b4 = 2;
          }
          std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&pos)
          ;
        } while (local_7b4 == 2);
        std::__cxx11::string::~string((string *)local_a60);
        std::__cxx11::string::~string((string *)local_a38);
        std::__cxx11::string::~string((string *)local_a10);
        std::__cxx11::string::~string((string *)local_9e8);
      }
    }
    std::
    set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
    ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
            *)local_128);
    HandleTransformCommand::Command::~Command
              ((Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListCommand::HandleTransformCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError(
      "sub-command TRANSFORM requires an action to be specified.");
    return false;
  }

  // Structure collecting all elements of the command
  struct Command
  {
    Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }

    std::string Name;
    std::string ListName;
    std::vector<std::string> Arguments;
    std::unique_ptr<TransformAction> Action;
    std::unique_ptr<TransformSelector> Selector;
    std::string OutputName;
  } command(args[1]);

  // Descriptor of action
  // Arity: number of arguments required for the action
  // Transform: lambda function implementing the action
  struct ActionDescriptor
  {
    ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }
    ActionDescriptor(std::string name, int arity, transform_type transform)
      : Name(std::move(name))
      , Arity(arity)
#if defined(__GNUC__) && __GNUC__ == 6 && defined(__aarch64__)
      // std::function move constructor miscompiles on this architecture
      , Transform(transform)
#else
      , Transform(std::move(transform))
#endif
    {
    }

    operator const std::string&() const { return Name; }

    std::string Name;
    int Arity = 0;
    transform_type Transform;
  };

  // Build a set of supported actions.
  std::set<ActionDescriptor,
           std::function<bool(const std::string&, const std::string&)>>
    descriptors(
      [](const std::string& x, const std::string& y) { return x < y; });
  descriptors = { { "APPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return s + command.Arguments[0];
                      }

                      return s;
                    } },
                  { "PREPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Arguments[0] + s;
                      }

                      return s;
                    } },
                  { "TOUPPER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::UpperCase(s);
                      }

                      return s;
                    } },
                  { "TOLOWER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::LowerCase(s);
                      }

                      return s;
                    } },
                  { "STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::TrimWhitespace(s);
                      }

                      return s;
                    } },
                  { "GENEX_STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmGeneratorExpression::Preprocess(
                          s,
                          cmGeneratorExpression::StripAllGeneratorExpressions);
                      }

                      return s;
                    } },
                  { "REPLACE", 2,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Action->Transform(s);
                      }

                      return s;
                    } } };

  using size_type = std::vector<std::string>::size_type;
  size_type index = 2;

  // Parse all possible function parameters
  auto descriptor = descriptors.find(args[index]);

  if (descriptor == descriptors.end()) {
    std::ostringstream error;
    error << " sub-command TRANSFORM, " << args[index] << " invalid action.";
    this->SetError(error.str());
    return false;
  }

  // Action arguments
  index += 1;
  if (args.size() < index + descriptor->Arity) {
    std::ostringstream error;
    error << "sub-command TRANSFORM, action " << descriptor->Name
          << " expects " << descriptor->Arity << " argument(s).";
    this->SetError(error.str());
    return false;
  }

  command.Name = descriptor->Name;
  index += descriptor->Arity;
  if (descriptor->Arity > 0) {
    command.Arguments =
      std::vector<std::string>(args.begin() + 3, args.begin() + index);
  }

  if (command.Name == "REPLACE") {
    try {
      command.Action =
        cm::make_unique<TransformReplace>(command.Arguments, this->Makefile);
    } catch (const transform_error& e) {
      this->SetError(e.what());
      return false;
    }
  }

  const std::string REGEX{ "REGEX" }, AT{ "AT" }, FOR{ "FOR" },
    OUTPUT_VARIABLE{ "OUTPUT_VARIABLE" };

  // handle optional arguments
  while (args.size() > index) {
    if ((args[index] == REGEX || args[index] == AT || args[index] == FOR) &&
        command.Selector) {
      std::ostringstream error;
      error << "sub-command TRANSFORM, selector already specified ("
            << command.Selector->Tag << ").";
      this->SetError(error.str());
      return false;
    }

    // REGEX selector
    if (args[index] == REGEX) {
      if (args.size() == ++index) {
        this->SetError("sub-command TRANSFORM, selector REGEX expects "
                       "'regular expression' argument.");
        return false;
      }

      command.Selector = cm::make_unique<TransformSelectorRegex>(args[index]);
      if (!command.Selector->Validate()) {
        std::ostringstream error;
        error << "sub-command TRANSFORM, selector REGEX failed to compile "
                 "regex \"";
        error << args[index] << "\".";
        this->SetError(error.str());
        return false;
      }

      index += 1;
      continue;
    }

    // AT selector
    if (args[index] == AT) {
      // get all specified indexes
      std::vector<int> indexes;
      while (args.size() > ++index) {
        std::size_t pos;
        int value;

        try {
          value = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number, stop processing
            break;
          }
          indexes.push_back(value);
        } catch (const std::invalid_argument&) {
          // this is not a number, stop processing
          break;
        }
      }

      if (indexes.empty()) {
        this->SetError(
          "sub-command TRANSFORM, selector AT expects at least one "
          "numeric value.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorAt>(std::move(indexes));

      continue;
    }

    // FOR selector
    if (args[index] == FOR) {
      if (args.size() <= ++index + 1) {
        this->SetError("sub-command TRANSFORM, selector FOR expects, at least,"
                       " two arguments.");
        return false;
      }

      int start = 0, stop = 0, step = 1;
      bool valid = true;
      try {
        std::size_t pos;

        start = std::stoi(args[index], &pos);
        if (pos != args[index].length()) {
          // this is not a number
          valid = false;
        } else {
          stop = std::stoi(args[++index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            valid = false;
          }
        }
      } catch (const std::invalid_argument&) {
        // this is not numbers
        valid = false;
      }
      if (!valid) {
        this->SetError("sub-command TRANSFORM, selector FOR expects, "
                       "at least, two numeric values.");
        return false;
      }
      // try to read a third numeric value for step
      if (args.size() > ++index) {
        try {
          std::size_t pos;

          step = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            step = 1;
          } else {
            index += 1;
          }
        } catch (const std::invalid_argument&) {
          // this is not number, ignore exception
        }
      }

      if (step < 0) {
        this->SetError("sub-command TRANSFORM, selector FOR expects "
                       "non negative numeric value for <step>.");
      }

      command.Selector =
        cm::make_unique<TransformSelectorFor>(start, stop, step);

      continue;
    }

    // output variable
    if (args[index] == OUTPUT_VARIABLE) {
      if (args.size() == ++index) {
        this->SetError("sub-command TRANSFORM, OUTPUT_VARIABLE "
                       "expects variable name argument.");
        return false;
      }

      command.OutputName = args[index++];
      continue;
    }

    std::ostringstream error;
    error << "sub-command TRANSFORM, '"
          << cmJoin(cmMakeRange(args).advance(index), " ")
          << "': unexpected argument(s).";
    this->SetError(error.str());
    return false;
  }

  // expand the list variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, command.ListName)) {
    this->Makefile->AddDefinition(command.OutputName, "");
    return true;
  }

  if (!command.Selector) {
    // no selector specified, apply transformation to all elements
    command.Selector = cm::make_unique<TransformNoSelector>();
  }

  try {
    command.Selector->Transform(varArgsExpanded, descriptor->Transform);
  } catch (const transform_error& e) {
    this->SetError(e.what());
    return false;
  }

  this->Makefile->AddDefinition(command.OutputName,
                                cmJoin(varArgsExpanded, ";").c_str());

  return true;
}